

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

uint8_t calculate_next_superres_scale(AV1_COMP *cpi)

{
  SUPERRES_AUTO_SEARCH_TYPE SVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  AV1_COMP *in_RDI;
  int qthresh_1;
  SUPERRES_AUTO_SEARCH_TYPE sr_search_type;
  int q_1;
  int top_index_1;
  int bottom_index_1;
  int qthresh;
  int q;
  int top_index;
  int bottom_index;
  int in_stack_00000034;
  uint8_t new_denom;
  RateControlCfg *rc_cfg;
  FrameDimensionCfg *frm_dim_cfg;
  SuperResCfg *superres_cfg;
  AV1EncoderConfig *oxcf;
  int local_64;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  AV1_COMP *cpi_00;
  uint8_t local_1;
  
  cpi_00 = (AV1_COMP *)&(in_RDI->oxcf).rc_cfg;
  iVar4 = is_stat_generation_stage(in_RDI);
  if (iVar4 == 0) {
    iVar4 = CONCAT13(8,(int3)in_stack_ffffffffffffffcc);
    switch(in_RDI->superres_mode) {
    case AOM_SUPERRES_NONE:
      iVar4 = 0x8000000;
      break;
    case AOM_SUPERRES_FIXED:
      if ((in_RDI->common).current_frame.frame_type == '\0') {
        bVar3 = (in_RDI->oxcf).superres_cfg.superres_kf_scale_denominator;
      }
      else {
        bVar3 = (in_RDI->oxcf).superres_cfg.superres_scale_denominator;
      }
      iVar4 = (uint)bVar3 << 0x18;
      break;
    case AOM_SUPERRES_RANDOM:
      uVar5 = lcg_rand16((uint32_t *)0x315568);
      iVar4 = (uint)(byte)((char)((ulong)uVar5 % 9) + 8) << 0x18;
      break;
    case AOM_SUPERRES_QTHRESH:
      if (((in_RDI->common).features.allow_screen_content_tools & 1U) == 0) {
        if ((*(aom_rc_mode *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[3] + 0xc) ==
             AOM_VBR) ||
           (*(aom_rc_mode *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[3] + 0xc) ==
            AOM_CQ)) {
          av1_set_target_rate((AV1_COMP *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
        iVar4 = av1_rc_pick_q_and_bounds
                          (cpi_00,iVar4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        iVar6 = frame_is_intra_only(&in_RDI->common);
        if (iVar6 == 0) {
          local_64 = (in_RDI->oxcf).superres_cfg.superres_qthresh;
        }
        else {
          local_64 = (in_RDI->oxcf).superres_cfg.superres_kf_qthresh;
        }
        if (local_64 < iVar4) {
          bVar3 = get_superres_denom_for_qindex
                            ((AV1_COMP *)rc_cfg,in_stack_00000034,bottom_index,top_index);
          uVar2 = (uint)bVar3;
        }
        else {
          uVar2 = 8;
        }
        iVar4 = uVar2 << 0x18;
      }
      break;
    case AOM_SUPERRES_AUTO:
      if (((in_RDI->common).features.allow_screen_content_tools & 1U) == 0) {
        if ((*(aom_rc_mode *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[3] + 0xc) ==
             AOM_VBR) ||
           (*(aom_rc_mode *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[3] + 0xc) ==
            AOM_CQ)) {
          av1_set_target_rate((AV1_COMP *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
        iVar4 = av1_rc_pick_q_and_bounds
                          (cpi_00,iVar4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                           (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        SVar1 = (in_RDI->sf).hl_sf.superres_auto_search_type;
        iVar6 = 0;
        if (SVar1 == '\x02') {
          iVar6 = 0x80;
        }
        if (iVar6 < iVar4) {
          if (SVar1 == '\0') {
            if ((in_RDI->common).current_frame.frame_type == '\0') {
              bVar3 = (in_RDI->oxcf).superres_cfg.superres_kf_scale_denominator;
            }
            else {
              bVar3 = (in_RDI->oxcf).superres_cfg.superres_scale_denominator;
            }
          }
          else {
            bVar3 = get_superres_denom_for_qindex
                              ((AV1_COMP *)rc_cfg,in_stack_00000034,bottom_index,top_index);
          }
          uVar2 = (uint)bVar3;
        }
        else {
          uVar2 = 8;
        }
        iVar4 = uVar2 << 0x18;
      }
    }
    local_1 = (uint8_t)((uint)iVar4 >> 0x18);
  }
  else {
    local_1 = '\b';
  }
  return local_1;
}

Assistant:

static uint8_t calculate_next_superres_scale(AV1_COMP *cpi) {
  // Choose an arbitrary random number
  static unsigned int seed = 34567;
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  const SuperResCfg *const superres_cfg = &oxcf->superres_cfg;
  const FrameDimensionCfg *const frm_dim_cfg = &oxcf->frm_dim_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  if (is_stat_generation_stage(cpi)) return SCALE_NUMERATOR;
  uint8_t new_denom = SCALE_NUMERATOR;

  // Make sure that superres mode of the frame is consistent with the
  // sequence-level flag.
  assert(IMPLIES(superres_cfg->superres_mode != AOM_SUPERRES_NONE,
                 cpi->common.seq_params->enable_superres));
  assert(IMPLIES(!cpi->common.seq_params->enable_superres,
                 superres_cfg->superres_mode == AOM_SUPERRES_NONE));
  // Make sure that superres mode for current encoding is consistent with user
  // provided superres mode.
  assert(IMPLIES(superres_cfg->superres_mode != AOM_SUPERRES_AUTO,
                 cpi->superres_mode == superres_cfg->superres_mode));

  // Note: we must look at the current superres_mode to be tried in 'cpi' here,
  // not the user given mode in 'oxcf'.
  switch (cpi->superres_mode) {
    case AOM_SUPERRES_NONE: new_denom = SCALE_NUMERATOR; break;
    case AOM_SUPERRES_FIXED:
      if (cpi->common.current_frame.frame_type == KEY_FRAME)
        new_denom = superres_cfg->superres_kf_scale_denominator;
      else
        new_denom = superres_cfg->superres_scale_denominator;
      break;
    case AOM_SUPERRES_RANDOM: new_denom = lcg_rand16(&seed) % 9 + 8; break;
    case AOM_SUPERRES_QTHRESH: {
      // Do not use superres when screen content tools are used.
      if (cpi->common.features.allow_screen_content_tools) break;
      if (rc_cfg->mode == AOM_VBR || rc_cfg->mode == AOM_CQ)
        av1_set_target_rate(cpi, frm_dim_cfg->width, frm_dim_cfg->height);

      // Now decide the use of superres based on 'q'.
      int bottom_index, top_index;
      const int q = av1_rc_pick_q_and_bounds(
          cpi, frm_dim_cfg->width, frm_dim_cfg->height, cpi->gf_frame_index,
          &bottom_index, &top_index);

      const int qthresh = (frame_is_intra_only(&cpi->common))
                              ? superres_cfg->superres_kf_qthresh
                              : superres_cfg->superres_qthresh;
      if (q <= qthresh) {
        new_denom = SCALE_NUMERATOR;
      } else {
        new_denom = get_superres_denom_for_qindex(cpi, q, 1, 1);
      }
      break;
    }
    case AOM_SUPERRES_AUTO: {
      if (cpi->common.features.allow_screen_content_tools) break;
      if (rc_cfg->mode == AOM_VBR || rc_cfg->mode == AOM_CQ)
        av1_set_target_rate(cpi, frm_dim_cfg->width, frm_dim_cfg->height);

      // Now decide the use of superres based on 'q'.
      int bottom_index, top_index;
      const int q = av1_rc_pick_q_and_bounds(
          cpi, frm_dim_cfg->width, frm_dim_cfg->height, cpi->gf_frame_index,
          &bottom_index, &top_index);

      const SUPERRES_AUTO_SEARCH_TYPE sr_search_type =
          cpi->sf.hl_sf.superres_auto_search_type;
      const int qthresh = (sr_search_type == SUPERRES_AUTO_SOLO) ? 128 : 0;
      if (q <= qthresh) {
        new_denom = SCALE_NUMERATOR;  // Don't use superres.
      } else {
        if (sr_search_type == SUPERRES_AUTO_ALL) {
          if (cpi->common.current_frame.frame_type == KEY_FRAME)
            new_denom = superres_cfg->superres_kf_scale_denominator;
          else
            new_denom = superres_cfg->superres_scale_denominator;
        } else {
          new_denom = get_superres_denom_for_qindex(cpi, q, 1, 1);
        }
      }
      break;
    }
    default: assert(0);
  }
  return new_denom;
}